

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

bool __thiscall pbrt::SquareMatrix<4>::operator!=(SquareMatrix<4> *this,SquareMatrix<4> *m2)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  Float *pFVar7;
  Float *pFVar8;
  ulong uVar9;
  ulong uVar10;
  
  pFVar7 = m2->m[0] + 1;
  pFVar8 = this->m[0] + 1;
  bVar6 = true;
  uVar9 = 0;
  do {
    fVar2 = this->m[uVar9][0];
    fVar3 = m2->m[uVar9][0];
    if (fVar2 != fVar3) {
      return bVar6;
    }
    if (NAN(fVar2) || NAN(fVar3)) {
      return bVar6;
    }
    uVar10 = 0xffffffffffffffff;
    do {
      if (uVar10 == 2) goto LAB_00291018;
      lVar4 = uVar10 + 1;
      uVar1 = uVar10 + 1;
      lVar5 = uVar10 + 1;
    } while ((pFVar8[lVar4] == pFVar7[lVar5]) &&
            (uVar10 = uVar1, !NAN(pFVar8[lVar4]) && !NAN(pFVar7[lVar5])));
    if (uVar1 < 3) {
      return bVar6;
    }
LAB_00291018:
    bVar6 = uVar9 < 3;
    uVar9 = uVar9 + 1;
    pFVar7 = pFVar7 + 4;
    pFVar8 = pFVar8 + 4;
    if (uVar9 == 4) {
      return bVar6;
    }
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    bool operator!=(const SquareMatrix<N> &m2) const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                if (m[i][j] != m2.m[i][j])
                    return true;
        return false;
    }